

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::TriaO1::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,TriaO1 *this,RefinementPattern *ref_pat,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  size_type sVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  size_type from;
  reference pvVar8;
  Index IVar9;
  ulong uVar10;
  string local_d08;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  stringstream local_c98 [8];
  stringstream ss_5;
  ostream local_c88 [376];
  undefined1 local_b10 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_b08;
  undefined1 local_b00 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_af8;
  undefined1 local_af0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_ae8;
  Type local_ae0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_ad0;
  Matrix<double,__1,__1,_0,__1,__1> local_a98;
  undefined1 local_a80 [8];
  MatrixXd child_geo;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  stringstream local_9f8 [8];
  stringstream ss_4;
  ostream local_9e8 [376];
  string local_870;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  stringstream local_800 [8];
  stringstream ss_3;
  ostream local_7f0 [376];
  uint local_678;
  undefined1 local_671;
  int l;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  stringstream local_600 [8];
  stringstream ss_2;
  ostream local_5f0 [380];
  uint local_474;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_470 [4];
  uint no_children;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  double local_458;
  double h_lattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  TriaO1 *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (TriaO1 *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kTria();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar6 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar6,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kTria()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0x67,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_24 < 3) {
    sVar3 = RefinementPattern::LatticeConst(pRStack_20);
    local_458 = 1.0 / (double)sVar3;
    (**(code **)(*(long *)pRStack_20 + 8))(local_470,pRStack_20,local_24);
    from = std::
           vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
           ::size(local_470);
    uVar4 = lf::base::narrow<unsigned_int,unsigned_long>(from);
    local_474 = uVar4;
    uVar5 = (*(code *)**(undefined8 **)pRStack_20)();
    if (uVar4 != uVar5) {
      std::__cxx11::stringstream::stringstream(local_600);
      poVar6 = std::operator<<(local_5f0,"no_children = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_474);
      poVar6 = std::operator<<(poVar6," <-> ");
      uVar4 = (*(code *)**(undefined8 **)pRStack_20)(pRStack_20,local_24);
      std::ostream::operator<<(poVar6,uVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_620,"no_children == ref_pat.NumChildren(codim)",&local_621);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                 ,&local_649);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_620,&local_648,0x72,(string *)&l);
      std::__cxx11::string::~string((string *)&l);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator(&local_649);
      std::__cxx11::string::~string((string *)&local_620);
      std::allocator<char>::~allocator(&local_621);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_671 = 0;
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ::vector(__return_storage_ptr__);
    local_678 = 0;
    while( true ) {
      if (local_474 <= local_678) {
        local_671 = 1;
        std::
        vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector(local_470);
        return __return_storage_ptr__;
      }
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_678);
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      if (IVar9 != 2) break;
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_678);
      uVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      if (uVar10 != 3 - local_24) {
        std::__cxx11::stringstream::stringstream(local_9f8);
        poVar6 = std::operator<<(local_9e8,"child_polygons[l].cols() = ");
        pvVar8 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](local_470,(long)(int)local_678);
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
        std::ostream::operator<<(poVar6,IVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a18,"child_polygons[l].cols() == 3 - codim",&local_a19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a40,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,&local_a41);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed
                  (&local_a18,&local_a40,0x7e,
                   (string *)
                   &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        std::__cxx11::string::~string
                  ((string *)
                   &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        std::__cxx11::string::~string((string *)&local_a40);
        std::allocator<char>::~allocator(&local_a41);
        std::__cxx11::string::~string((string *)&local_a18);
        std::allocator<char>::~allocator(&local_a19);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_678);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
                (&local_ae0,(DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      Eigen::operator*(&local_ad0,&local_458,(StorageBaseType *)&local_ae0);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_a98,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_ad0);
      (*(this->super_Geometry)._vptr_Geometry[3])(local_a80,this,&local_a98);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a98);
      if (local_24 == 0) {
        std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_af0);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_ae8,
                   (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                   local_af0);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_ae8);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_ae8);
        std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                    local_af0);
      }
      else if (local_24 == 1) {
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_b00);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_af8,
                   (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                    *)local_b00);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_af8);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_af8);
        std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                     *)local_b00);
      }
      else {
        if (local_24 != 2) {
          std::__cxx11::stringstream::stringstream(local_c98);
          std::operator<<(local_c88,"codim out of bounds.");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cb8,"false",&local_cb9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ce0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                     ,&local_ce1);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_cb8,&local_ce0,0x93,&local_d08);
          std::__cxx11::string::~string((string *)&local_d08);
          std::__cxx11::string::~string((string *)&local_ce0);
          std::allocator<char>::~allocator(&local_ce1);
          std::__cxx11::string::~string((string *)&local_cb8);
          std::allocator<char>::~allocator(&local_cb9);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"this code should not be reached");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_b10);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_b08,
                   (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_b10);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_b08);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_b08);
        std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                  ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_b10);
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_a80);
      local_678 = local_678 + 1;
    }
    std::__cxx11::stringstream::stringstream(local_800);
    poVar6 = std::operator<<(local_7f0,"child_polygons[l].rows() = ");
    pvVar8 = std::
             vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](local_470,(long)(int)local_678);
    IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
    std::ostream::operator<<(poVar6,IVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"child_polygons[l].rows() == 2",&local_821);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,&local_849);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_820,&local_848,0x7c,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator(&local_821);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_3e0);
  poVar6 = std::operator<<(local_3d0,"Illegal codim ");
  std::ostream::operator<<(poVar6,local_24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"codim < 3",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
             ,&local_429);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_400,&local_428,0x68,(string *)&h_lattice);
  std::__cxx11::string::~string((string *)&h_lattice);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"this code should not be reached");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> TriaO1::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  // The refinement pattern must be for a triangle
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kTria(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);
  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Obtain geometry of children as lattice polygon
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child segments
  const auto no_children = base::narrow<base::size_type>(child_polygons.size());
  LF_VERIFY_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));
  // return variable
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  // For each child triangle create a geometry object and a unique pointer to
  // it.
  for (int l = 0; l < no_children; l++) {
    // A single child triangle is described by a lattice polygon with
    // three vertices, a child segment by a polygon with two vertices,
    // a child point by a single point = "polygon with one corner"
    LF_VERIFY_MSG(child_polygons[l].rows() == 2,
                  "child_polygons[l].rows() = " << child_polygons[l].rows());
    LF_VERIFY_MSG(child_polygons[l].cols() == 3 - codim,
                  "child_polygons[l].cols() = " << child_polygons[l].cols());
    // Normalize lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[l].cast<double>()));
    switch (codim) {
      case 0: {
        // child is a triangle
        child_geo_uptrs.push_back(std::make_unique<TriaO1>(child_geo));
        break;
      }
      case 1: {
        // child is an edge
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 2: {
        // child is a node
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default:
        LF_VERIFY_MSG(false, "codim out of bounds.");
    }  // end switch codim
  }  // end loop over the children
  return (child_geo_uptrs);
}